

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.h
# Opt level: O0

ostream * operator<<(ostream *ostream,Order *order)

{
  _Setw _Var1;
  ostream *poVar2;
  string *psVar3;
  long lVar4;
  double dVar5;
  Order *order_local;
  ostream *ostream_local;
  
  poVar2 = std::operator<<(ostream,"ID: ");
  _Var1 = std::setw(10);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,",");
  psVar3 = Order::getClientID_abi_cxx11_(order);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2," OWNER: ");
  _Var1 = std::setw(10);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,",");
  psVar3 = Order::getOwner_abi_cxx11_(order);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2," PRICE: ");
  _Var1 = std::setw(10);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,",");
  dVar5 = Order::getPrice(order);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar5);
  poVar2 = std::operator<<(poVar2," QUANTITY: ");
  _Var1 = std::setw(10);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<(poVar2,",");
  lVar4 = Order::getQuantity(order);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar4);
  return poVar2;
}

Assistant:

inline std::ostream &operator<<(std::ostream &ostream, const Order &order) {
  return ostream << "ID: " << std::setw(10) << "," << order.getClientID() << " OWNER: " << std::setw(10) << ","
                 << order.getOwner() << " PRICE: " << std::setw(10) << "," << order.getPrice()
                 << " QUANTITY: " << std::setw(10) << "," << order.getQuantity();
}